

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O2

int linfgets(lindef *lin,uchar *buf,uint siz)

{
  uchar uVar1;
  uchar *nxt;
  long __off;
  char *pcVar2;
  uchar *puVar3;
  uchar *puVar4;
  
  __off = ftell((FILE *)lin[1].lingetp);
  pcVar2 = fgets((char *)buf,siz,(FILE *)lin[1].lingetp);
  if (pcVar2 != (char *)0x0) {
    do {
      __off = __off + 1;
      puVar4 = buf + 1;
      uVar1 = *buf;
      if (uVar1 == '\0') goto LAB_001142a7;
      puVar3 = puVar4;
    } while ((uVar1 != '\n') && (buf = puVar4, uVar1 != '\r'));
    for (; (uVar1 = *puVar3, uVar1 == '\n' || (uVar1 == '\r')); puVar3 = puVar3 + 1) {
      __off = __off + 1;
    }
    if (uVar1 == '\0') {
      *puVar4 = '\0';
    }
    else {
      *puVar4 = '\0';
      fseek((FILE *)lin[1].lingetp,__off,0);
    }
  }
LAB_001142a7:
  return (int)(pcVar2 != (char *)0x0);
}

Assistant:

int linfgets(lindef *lin, uchar *buf, uint siz)
{
    int    ret;
    long   startpos;
    uchar *p;
#   define  linf ((linfdef *)lin)

    /* note the seek offset at the start of the line */
    startpos = osfpos(linf->linffp);

    /* read the next line */
    ret = (osfgets((char *)buf, siz, linf->linffp) != 0);
    if (!ret)
        return ret;

    /* scan for non-standard line endings */
    for (p = buf ; *p != '\0' && *p != '\r' && *p != '\n' ; ++p) ;
    if (*p != '\0')
    {
        uchar *nxt;
        
        /* 
         *   Scan for non-line-ending characters after this line-ending
         *   character.  If we find any, we must have non-standard newline
         *   conventions in this file.  To be tolerant of these, seek back
         *   to the start of the next line in these cases and read the
         *   next line from the new location. 
         */
        for (nxt = p + 1 ; *nxt == '\r' || *nxt == '\n' ; ++nxt) ;
        if (*nxt == '\0')
        {
            /* 
             *   we had only line-ending characters after the first
             *   line-ending character -- simply end the line after the
             *   first line-ending character 
             */
            *(p+1) = '\0';
        }
        else
        {
            /*
             *   We had a line-ending character in the middle of other
             *   text, so we must have a file that doesn't conform to
             *   local newline conventions.  Seek back to the next
             *   character following the last line-ending character so
             *   that we start the next line here, and end the current
             *   line after the first line-ending character. 
             */
            *(p+1) = '\0';
            osfseek(linf->linffp, startpos + (nxt - buf), OSFSK_SET);
        }
    }

    /* return the result */
    return ret;

#   undef linf
}